

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_data_converter_get_expected_output_frame_count
                    (ma_data_converter *pConverter,ma_uint64 inputFrameCount,
                    ma_uint64 *pOutputFrameCount)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pOutputFrameCount != (ma_uint64 *)0x0) &&
     (*pOutputFrameCount = 0, pConverter != (ma_data_converter *)0x0)) {
    if (pConverter->hasResampler != '\0') {
      mVar1 = ma_resampler_get_expected_output_frame_count
                        (&pConverter->resampler,inputFrameCount,pOutputFrameCount);
      return mVar1;
    }
    *pOutputFrameCount = inputFrameCount;
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_data_converter_get_expected_output_frame_count(const ma_data_converter* pConverter, ma_uint64 inputFrameCount, ma_uint64* pOutputFrameCount)
{
    if (pOutputFrameCount == NULL) {
        return MA_INVALID_ARGS;
    }

    *pOutputFrameCount = 0;

    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConverter->hasResampler) {
        return ma_resampler_get_expected_output_frame_count(&pConverter->resampler, inputFrameCount, pOutputFrameCount);
    } else {
        *pOutputFrameCount = inputFrameCount;   /* 1:1 */
        return MA_SUCCESS;
    }
}